

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O0

bool is_dir_inst(int ch,bool allowrel)

{
  bool allowrel_local;
  int ch_local;
  
  if (ch != 0x61) {
    if (ch - 0x62U < 2) {
      return allowrel;
    }
    if (ch != 100) {
      if (ch - 0x65U < 2) {
        return allowrel;
      }
      if (ch != 0x6c) {
        if (ch == 0x6e) {
          return allowrel;
        }
        if (((ch != 0x6f) && (1 < ch - 0x72U)) && (ch != 0x75)) {
          if (ch == 0x77) {
            return allowrel;
          }
          if (ch != 0x79 && ch != 0x7a) {
            return false;
          }
        }
      }
    }
  }
  return true;
}

Assistant:

bool is_dir_inst(int ch, bool allowrel) {
    switch (ch) {
    case INST_D_RIGHT:
    case INST_D_UP:
    case INST_D_LEFT:
    case INST_D_DOWN:
    case INST_D_ORTHOGONAL:
    case INST_D_DIAGONAL:
    case INST_D_OCTILINEAR:
    case INST_D_STATIONARY:
    case INST_D_ABSNUM:
        return true;
    case INST_D_RELNUM:
    case INST_D_CLOCKWISE:
    case INST_D_COUNTERCLOCKWISE:
    case INST_D_FORWARD:
    case INST_D_BACKWARD:
    case INST_D_NORMAL:
        return allowrel;
    default:
        return false;
    }
}